

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  stack_st_GENERAL_NAME *sk;
  OPENSSL_STACK *pOVar5;
  uint32_t *puVar6;
  byte local_79;
  size_t name_len;
  char *name;
  GENERAL_NAME *val;
  int i;
  int count;
  bool ip_mached;
  bool dsn_matched;
  stack_st_GENERAL_NAME *alt_names;
  size_t addr_len;
  undefined1 local_30 [4];
  in_addr addr;
  in6_addr addr6;
  int type;
  bool ret;
  X509 *server_cert_local;
  SSLClient *this_local;
  
  addr6.__in6_u.__u6_addr8[0xf] = '\0';
  addr6.__in6_u.__u6_addr32[2] = 2;
  alt_names = (stack_st_GENERAL_NAME *)0x0;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = inet_pton(10,pcVar4,local_30);
  if (iVar2 == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = inet_pton(2,pcVar4,(void *)((long)&addr_len + 4));
    if (iVar2 != 0) {
      addr6.__in6_u.__u6_addr32[2] = 7;
      alt_names = (stack_st_GENERAL_NAME *)0x4;
    }
  }
  else {
    addr6.__in6_u.__u6_addr32[2] = 7;
    alt_names = (stack_st_GENERAL_NAME *)0x10;
  }
  sk = (stack_st_GENERAL_NAME *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (sk != (stack_st_GENERAL_NAME *)0x0) {
    i._3_1_ = false;
    bVar1 = false;
    pOVar5 = ossl_check_const_GENERAL_NAME_sk_type(sk);
    iVar2 = OPENSSL_sk_num(pOVar5);
    val._4_4_ = 0;
    while( true ) {
      local_79 = 0;
      if (val._4_4_ < iVar2) {
        local_79 = i._3_1_ ^ 0xff;
      }
      if ((local_79 & 1) == 0) break;
      pOVar5 = ossl_check_const_GENERAL_NAME_sk_type(sk);
      puVar6 = (uint32_t *)OPENSSL_sk_value(pOVar5,val._4_4_);
      if (*puVar6 == addr6.__in6_u.__u6_addr32[2]) {
        pcVar4 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(puVar6 + 2));
        iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(puVar6 + 2));
        if (addr6.__in6_u.__u6_addr32[2] == 2) {
          i._3_1_ = check_host_name(this,pcVar4,(long)iVar3);
        }
        else if ((addr6.__in6_u.__u6_addr32[2] == 7) &&
                ((iVar3 = memcmp(local_30,pcVar4,(size_t)alt_names), iVar3 == 0 ||
                 (iVar3 = memcmp((void *)((long)&addr_len + 4),pcVar4,(size_t)alt_names), iVar3 == 0
                 )))) {
          bVar1 = true;
        }
      }
      val._4_4_ = val._4_4_ + 1;
    }
    if ((i._3_1_ != false) || (bVar1)) {
      addr6.__in6_u.__u6_addr8[0xf] = '\x01';
    }
  }
  GENERAL_NAMES_free((GENERAL_NAMES *)sk);
  return (bool)addr6.__in6_u.__u6_addr8[0xf];
}

Assistant:

inline bool
        SSLClient::verify_host_with_subject_alt_name(X509 * server_cert) const {
        auto ret = false;

        auto type = GEN_DNS;

        struct in6_addr addr6;
        struct in_addr addr;
        size_t addr_len = 0;

    #ifndef __MINGW32__
        if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in6_addr);
        } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in_addr);
        }
    #endif

        auto alt_names = static_cast<const struct stack_st_GENERAL_NAME*>(
            X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

        if (alt_names) {
            auto dsn_matched = false;
            auto ip_mached = false;

            auto count = sk_GENERAL_NAME_num(alt_names);

            for (decltype(count) i = 0; i < count && !dsn_matched; i++) {
                auto val = sk_GENERAL_NAME_value(alt_names, i);
                if (val->type == type) {
                    auto name = (const char*)ASN1_STRING_get0_data(val->d.ia5);
                    auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

                    switch (type) {
                        case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

                        case GEN_IPADD:
                            if (!memcmp(&addr6, name, addr_len) ||
                                !memcmp(&addr, name, addr_len)) {
                                ip_mached = true;
                            }
                            break;
                    }
                }
            }

            if (dsn_matched || ip_mached) { ret = true; }
        }

        GENERAL_NAMES_free((STACK_OF(GENERAL_NAME)*)alt_names);
        return ret;
    }